

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O0

void __thiscall ImFont::ImFont(ImFont *this)

{
  ImVector<float> *in_RDI;
  ImVec2 local_1c [3];
  
  ImVector<float>::ImVector(in_RDI);
  ImVector<unsigned_short>::ImVector((ImVector<unsigned_short> *)&in_RDI[1].Data);
  ImVector<ImFontGlyph>::ImVector((ImVector<ImFontGlyph> *)&in_RDI[2].Data);
  ImVec2::ImVec2((ImVec2 *)(in_RDI + 4));
  in_RDI[1].Capacity = 0;
  in_RDI[1].Size = 0;
  *(undefined2 *)((long)&in_RDI[5].Data + 2) = 0x3f;
  *(undefined2 *)((long)&in_RDI[5].Data + 4) = 0xffff;
  ImVec2::ImVec2(local_1c,0.0,0.0);
  in_RDI[4].Size = (int)local_1c[0].x;
  in_RDI[4].Capacity = (int)local_1c[0].y;
  in_RDI[3].Data = (float *)0x0;
  in_RDI[4].Data = (float *)0x0;
  in_RDI[5].Size = 0;
  in_RDI[5].Capacity = 0;
  *(undefined2 *)&in_RDI[5].Data = 0;
  *(undefined1 *)&in_RDI[7].Size = 0;
  in_RDI[6].Size = 0x3f800000;
  *(undefined4 *)&in_RDI[6].Data = 0;
  in_RDI[6].Capacity = 0;
  *(undefined4 *)((long)&in_RDI[6].Data + 4) = 0;
  return;
}

Assistant:

ImFont::ImFont()
{
    FontSize = 0.0f;
    FallbackAdvanceX = 0.0f;
    FallbackChar = (ImWchar)'?';
    EllipsisChar = (ImWchar)-1;
    DisplayOffset = ImVec2(0.0f, 0.0f);
    FallbackGlyph = NULL;
    ContainerAtlas = NULL;
    ConfigData = NULL;
    ConfigDataCount = 0;
    DirtyLookupTables = false;
    Scale = 1.0f;
    Ascent = Descent = 0.0f;
    MetricsTotalSurface = 0;
}